

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  Nonnull<const_char_*> failure_msg;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar2;
  anon_enum_32 local_24;
  LogMessage local_20;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x266,"extension != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  local_20.errno_saver_.saved_errno_ = pEVar1->is_repeated ^ CPPTYPE_INT32;
  local_24 = REPEATED_FIELD;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                          ((anon_enum_32 *)&local_20,&local_24,
                           "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_20.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar1->type);
    local_24 = 9;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_20,&local_24,
                             "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pVVar2 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)pEVar1->field_0,index);
      return pVVar2;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x267,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

std::string* ExtensionSet::MutableRepeatedString(int number, int index) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  return extension->ptr.repeated_string_value->Mutable(index);
}